

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O3

FailureReporterInterface * testing::internal::GetFailureReporter(void)

{
  if (GetFailureReporter()::failure_reporter == '\0') {
    GetFailureReporter();
  }
  return GetFailureReporter::failure_reporter;
}

Assistant:

GTEST_API_ FailureReporterInterface* GetFailureReporter() {
  // Points to the global failure reporter used by Google Mock.  gcc
  // guarantees that the following use of failure_reporter is
  // thread-safe.  We may need to add additional synchronization to
  // protect failure_reporter if we port Google Mock to other
  // compilers.
  static FailureReporterInterface* const failure_reporter =
      new GoogleTestFailureReporter();
  return failure_reporter;
}